

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

InstanceSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InstanceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation&,slang::ast::DefinitionSymbol_const&,slang::ast::ParameterBuilder&,slang::ast::InstanceFlags>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          DefinitionSymbol *args_3,ParameterBuilder *args_4,InstanceFlags *args_5)

{
  SourceLocation instanceLoc;
  size_t sVar1;
  char *pcVar2;
  InstanceBodySymbol *pIVar3;
  InstanceSymbol *pIVar4;
  
  pIVar4 = (InstanceSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InstanceSymbol *)this->endPtr < pIVar4 + 1) {
    pIVar4 = (InstanceSymbol *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pIVar4 + 1);
  }
  sVar1 = args_1->_M_len;
  pcVar2 = args_1->_M_str;
  instanceLoc = *args_2;
  pIVar3 = ast::InstanceBodySymbol::fromDefinition
                     (args,args_3,instanceLoc,args_4,(bitmask<slang::ast::InstanceFlags>)*args_5);
  (pIVar4->super_InstanceSymbolBase).super_Symbol.kind = Instance;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.name._M_len = sVar1;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.name._M_str = pcVar2;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.location = instanceLoc;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.parentScope = (Scope *)0x0;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.nextInScope = (Symbol *)0x0;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.indexInScope = 0;
  (pIVar4->super_InstanceSymbolBase).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (pIVar4->super_InstanceSymbolBase).arrayPath._M_ptr = (pointer)0x0;
  (pIVar4->super_InstanceSymbolBase).arrayPath._M_extent._M_extent_value = 0;
  pIVar4->body = pIVar3;
  pIVar4->resolvedConfig = (ResolvedConfig *)0x0;
  pIVar4->connectionMap = (PointerMap *)0x0;
  (pIVar4->connections)._M_ptr = (pointer)0x0;
  (pIVar4->connections)._M_extent._M_extent_value = 0;
  pIVar4->canonicalBody = (InstanceBodySymbol *)0x0;
  pIVar3->parentInstance = pIVar4;
  return pIVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }